

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O1

void __thiscall embree::Points::updateBuffer(Points *this,RTCBufferType type,uint slot)

{
  uint *puVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  undefined8 *puVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (type == RTC_BUFFER_TYPE_NORMAL) {
    if ((this->normals).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar3 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar3 + 1) = 2;
      puVar3[2] = puVar3 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (BufferView<embree::Vec3fx> *)((this->normals).items + slot);
  }
  else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar3 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar3 + 1) = 2;
      puVar3[2] = puVar3 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (BufferView<embree::Vec3fx> *)((this->vertexAttribs).items + slot);
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown buffer type","");
      *puVar3 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar3 + 1) = 2;
      puVar3[2] = puVar3 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid buffer slot","");
      *puVar3 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar3 + 1) = 2;
      puVar3[2] = puVar3 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (this->vertices).items + slot;
  }
  puVar1 = &(pBVar2->super_RawBufferView).modCounter;
  *puVar1 = *puVar1 + 1;
  (pBVar2->super_RawBufferView).modified = true;
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void Points::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type == RTC_BUFFER_TYPE_VERTEX) {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    } else if (type == RTC_BUFFER_TYPE_NORMAL) {
      if (slot >= normals.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      normals[slot].setModified();
    } else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    } else {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }